

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

FIOBJ http_mimetype_find(char *file_ext,size_t file_ext_len)

{
  uint64_t hash_value;
  FIOBJ FVar1;
  uintptr_t hash;
  size_t file_ext_len_local;
  char *file_ext_local;
  
  hash_value = fio_siphash13(file_ext,file_ext_len,0,0);
  FVar1 = fio_mime_set_find(&fio_http_mime_types,hash_value,0);
  FVar1 = fiobj_dup(FVar1);
  return FVar1;
}

Assistant:

FIOBJ http_mimetype_find(char *file_ext, size_t file_ext_len) {
  uintptr_t hash = FIO_HASH_FN(file_ext, file_ext_len, 0, 0);
  return fiobj_dup(
      fio_mime_set_find(&fio_http_mime_types, hash, FIOBJ_INVALID));
}